

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  char *pcVar1;
  xpath_node *pxVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  char *src;
  bool bVar6;
  xpath_node local_48;
  xml_node local_38;
  xml_attribute local_30;
  
  if (a == (xml_attribute_struct *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x2742,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_attribute_struct *, xml_node_struct *, xpath_allocator *)"
                 );
  }
  src = "";
  if (a->name != (char_t *)0x0) {
    src = a->name;
  }
  bVar6 = false;
  switch(this->_test) {
  case '\x01':
    bVar6 = strequal(src,(this->_data).string);
    if (!bVar6) {
      return false;
    }
    if (*src == 'x') {
      lVar4 = 0;
      do {
        cVar5 = "xmlns"[lVar4 + 1];
        if (lVar4 == 4) break;
        lVar3 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (src[lVar3] == cVar5);
LAB_001a4708:
      if (cVar5 == '\0') {
        if (src[5] == '\0') {
          return false;
        }
        if (src[5] == ':') {
          return false;
        }
      }
    }
    break;
  case '\x02':
  case '\a':
    if (*src == 'x') {
      lVar4 = 0;
      do {
        cVar5 = "xmlns"[lVar4 + 1];
        if (lVar4 == 4) break;
        lVar3 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (src[lVar3] == cVar5);
      goto LAB_001a4708;
    }
    break;
  default:
    goto switchD_001a4631_caseD_3;
  case '\b':
    cVar5 = *(this->_data).string;
    bVar6 = cVar5 == '\0';
    if ((!bVar6) && (*src == cVar5)) {
      lVar4 = 1;
      do {
        cVar5 = (this->_data).string[lVar4];
        bVar6 = cVar5 == '\0';
        if (bVar6) break;
        pcVar1 = src + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pcVar1 == cVar5);
    }
    if (!bVar6) {
      return false;
    }
    if (*src == 'x') {
      lVar4 = 0;
      do {
        cVar5 = "xmlns"[lVar4 + 1];
        if (lVar4 == 4) break;
        lVar3 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (src[lVar3] == cVar5);
      goto LAB_001a4708;
    }
  }
  xml_attribute::xml_attribute(&local_30,a);
  xml_node::xml_node(&local_38,parent);
  xpath_node::xpath_node(&local_48,&local_30,&local_38);
  pxVar2 = ns->_end;
  if (pxVar2 == ns->_eos) {
    xpath_node_set_raw::push_back_grow(ns,&local_48,alloc);
  }
  else {
    ns->_end = pxVar2 + 1;
    (pxVar2->_node)._root = local_48._node._root;
    (pxVar2->_attribute)._attr = local_48._attribute._attr;
  }
  bVar6 = true;
switchD_001a4631_caseD_3:
  return bVar6;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}